

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

void __thiscall
rengine::SDLBackend::sendPointerEvent(SDLBackend *this,SDL_Event *sdlEvent,Type type)

{
  Uint32 UVar1;
  uint uVar2;
  vec2 local_50;
  vec2 local_48;
  undefined1 local_40 [8];
  PointerEvent pe;
  Type type_local;
  SDL_Event *sdlEvent_local;
  SDLBackend *this_local;
  
  pe._28_4_ = type;
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x98,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  UVar1 = SDL_GetWindowID(this->m_window);
  if (UVar1 == (sdlEvent->display).display) {
    if (this->m_surface != (Surface *)0x0) {
      PointerEvent::PointerEvent((PointerEvent *)local_40,pe._28_4_);
      vec2::vec2(&local_50,(float)(sdlEvent->window).data2,(float)(sdlEvent->motion).y);
      uVar2 = devicePixelRatio(this);
      local_48 = vec2::operator*(&local_50,(float)uVar2);
      PointerEvent::initialize((PointerEvent *)local_40,local_48);
      (*this->m_surface->_vptr_Surface[3])(this->m_surface,local_40);
      PointerEvent::~PointerEvent((PointerEvent *)local_40);
      return;
    }
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x9a,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  __assert_fail("SDL_GetWindowID(m_window) == sdlEvent->button.windowID",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0x99,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
}

Assistant:

inline void SDLBackend::sendPointerEvent(SDL_Event *sdlEvent, Event::Type type)
{
    assert(m_window);
    assert(SDL_GetWindowID(m_window) == sdlEvent->button.windowID);
    assert(m_surface);

    PointerEvent pe(type);
    pe.initialize(vec2(sdlEvent->button.x, sdlEvent->button.y) * devicePixelRatio());
    m_surface->onEvent(&pe);
}